

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O3

_Bool spki_records_are_equal(spki_record *r1,spki_record *r2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  int iVar4;
  long in_FS_OFFSET;
  _Bool _Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if ((r1->asn == r2->asn) && (r1->socket == r2->socket)) {
    auVar6[0] = -(r2->ski[0] == r1->ski[0]);
    auVar6[1] = -(r2->ski[1] == r1->ski[1]);
    auVar6[2] = -(r2->ski[2] == r1->ski[2]);
    auVar6[3] = -(r2->ski[3] == r1->ski[3]);
    auVar6[4] = -(r2->ski[4] == r1->ski[4]);
    auVar6[5] = -(r2->ski[5] == r1->ski[5]);
    auVar6[6] = -(r2->ski[6] == r1->ski[6]);
    auVar6[7] = -(r2->ski[7] == r1->ski[7]);
    auVar6[8] = -(r2->ski[8] == r1->ski[8]);
    auVar6[9] = -(r2->ski[9] == r1->ski[9]);
    auVar6[10] = -(r2->ski[10] == r1->ski[10]);
    auVar6[0xb] = -(r2->ski[0xb] == r1->ski[0xb]);
    auVar6[0xc] = -(r2->ski[0xc] == r1->ski[0xc]);
    auVar6[0xd] = -(r2->ski[0xd] == r1->ski[0xd]);
    auVar6[0xe] = -(r2->ski[0xe] == r1->ski[0xe]);
    auVar6[0xf] = -(r2->ski[0xf] == r1->ski[0xf]);
    uVar1 = *(undefined4 *)(r1->ski + 0x10);
    uVar2 = *(undefined4 *)(r2->ski + 0x10);
    auVar7[0] = -((char)uVar2 == (char)uVar1);
    auVar7[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
    auVar7[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
    auVar7[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
    auVar7[4] = 0xff;
    auVar7[5] = 0xff;
    auVar7[6] = 0xff;
    auVar7[7] = 0xff;
    auVar7[8] = 0xff;
    auVar7[9] = 0xff;
    auVar7[10] = 0xff;
    auVar7[0xb] = 0xff;
    auVar7[0xc] = 0xff;
    auVar7[0xd] = 0xff;
    auVar7[0xe] = 0xff;
    auVar7[0xf] = 0xff;
    auVar7 = auVar7 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
      iVar4 = bcmp(r1->spki,r2->spki,0x5b);
      _Var5 = iVar4 == 0;
      goto LAB_00103f6e;
    }
  }
  _Var5 = false;
LAB_00103f6e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return _Var5;
  }
  __stack_chk_fail();
}

Assistant:

static bool spki_records_are_equal(struct spki_record *r1, struct spki_record *r2)
{
	if (r1->asn != r2->asn)
		return false;
	if (r1->socket != r2->socket)
		return false;
	if (memcmp(r1->ski, r2->ski, SKI_SIZE) != 0)
		return false;
	if (memcmp(r1->spki, r2->spki, SPKI_SIZE) != 0)
		return false;

	return true;
}